

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_fma::forward
          (BinaryOp_x86_fma *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  Mat *pMVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint _elempack;
  int _d;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Option *pOVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  Mat *b;
  int iVar16;
  Mat *pMVar17;
  Option *opt_00;
  Option *_elemsize;
  bool bVar18;
  undefined1 auVar19 [16];
  Mat local_128;
  Mat local_d8;
  undefined1 local_88 [44];
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  uint local_50;
  size_t local_48;
  BinaryOp_x86_fma *local_38;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar4->dims;
  local_d8.dims = pMVar4[1].dims;
  uVar7 = local_d8.dims;
  if (local_d8.dims < (int)uVar3) {
    uVar7 = uVar3;
  }
  piVar5 = pMVar4->refcount;
  local_88._0_8_ = pMVar4->data;
  local_88._8_8_ = pMVar4->refcount;
  local_88._16_8_ = pMVar4->elemsize;
  local_88._24_4_ = pMVar4->elempack;
  local_88._32_8_ = pMVar4->allocator;
  auVar6 = vpinsrd_avx(ZEXT416(uVar3),pMVar4->w,1);
  uVar1 = pMVar4->h;
  uVar2 = pMVar4->d;
  auVar19._4_4_ = uVar2;
  auVar19._0_4_ = uVar1;
  auVar19._8_8_ = 0;
  unique0x00103380 = vpunpcklqdq_avx(auVar6,auVar19);
  local_50 = pMVar4->c;
  local_48 = pMVar4->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
    local_d8.dims = pMVar4[1].dims;
  }
  piVar5 = pMVar4[1].refcount;
  local_d8.data = pMVar4[1].data;
  local_d8.refcount = pMVar4[1].refcount;
  local_d8.elemsize = pMVar4[1].elemsize;
  local_d8.elempack = pMVar4[1].elempack;
  local_d8.allocator = pMVar4[1].allocator;
  uVar8 = pMVar4[1].w;
  uVar9 = pMVar4[1].h;
  uVar10 = pMVar4[1].d;
  uVar11 = pMVar4[1].c;
  local_d8.cstep = pMVar4[1].cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  pMVar17 = pMVar4 + 1;
  local_d8.w = uVar8;
  local_d8.h = uVar9;
  local_d8.d = uVar10;
  local_d8.c = uVar11;
  local_38 = this;
  if (pMVar4->dims < (int)uVar7) {
    if (uVar7 == 2) {
      sVar14 = (long)pMVar4->elempack * (long)pMVar4->w;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar4[1].elempack * pMVar4[1].h) {
        Mat::reshape(&local_128,pMVar4,1,pMVar4->w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if ((int *)local_88._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._8_8_ == 0) {
            if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
              free((void *)local_88._0_8_);
            }
            else {
              (*(*(_func_int ***)local_88._32_8_)[3])();
            }
          }
        }
        local_88._0_8_ = local_128.data;
        local_88._8_8_ = local_128.refcount;
        local_88._16_8_ = local_128.elemsize;
        local_88._24_4_ = local_128.elempack;
        local_88._32_8_ = local_128.allocator;
        iStack_58 = local_128.h;
        iStack_54 = local_128.d;
        local_88._40_4_ = local_128.dims;
        iStack_5c = local_128.w;
        local_50 = local_128.c;
        local_48 = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        iStack_5c = iVar13;
        local_88._40_4_ = 2;
        local_88._24_4_ = 1;
        local_88._16_8_ = pMVar4->elemsize / (ulong)(long)pMVar4->elempack;
        local_48 = sVar14;
      }
    }
    if ((uVar7 == 3) && (pMVar4->dims == 1)) {
      sVar14 = (long)pMVar4->elempack * (long)pMVar4->w;
      iVar13 = (int)sVar14;
      if (iVar13 == pMVar4[1].elempack * pMVar4[1].c) {
        Mat::reshape(&local_128,pMVar4,1,1,pMVar4->w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if ((int *)local_88._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_88._8_8_ == 0) {
            if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
              free((void *)local_88._0_8_);
            }
            else {
              (*(*(_func_int ***)local_88._32_8_)[3])();
            }
          }
        }
        local_88._0_8_ = local_128.data;
        local_88._8_8_ = local_128.refcount;
        local_88._16_8_ = local_128.elemsize;
        local_88._24_4_ = local_128.elempack;
        local_88._32_8_ = local_128.allocator;
        iStack_58 = local_128.h;
        iStack_54 = local_128.d;
        local_88._40_4_ = local_128.dims;
        iStack_5c = local_128.w;
        local_50 = local_128.c;
        local_48 = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        iStack_5c = iVar13;
        local_88._40_4_ = 3;
        local_88._24_4_ = 1;
        local_88._16_8_ = pMVar4->elemsize / (ulong)(long)pMVar4->elempack;
        local_48 = sVar14;
      }
    }
    if (pMVar4->dims == 2 && uVar7 == 3) {
      Mat::reshape(&local_128,pMVar4,1,pMVar4->w,pMVar4->h,opt->workspace_allocator);
      if (local_128.refcount != (int *)0x0) {
        LOCK();
        *local_128.refcount = *local_128.refcount + 1;
        UNLOCK();
      }
      if ((int *)local_88._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_88._8_8_ == 0) {
          if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
            free((void *)local_88._0_8_);
          }
          else {
            (*(*(_func_int ***)local_88._32_8_)[3])();
          }
        }
      }
      local_88._0_8_ = local_128.data;
      local_88._8_8_ = local_128.refcount;
      local_88._16_8_ = local_128.elemsize;
      local_88._24_4_ = local_128.elempack;
      local_88._32_8_ = local_128.allocator;
      iStack_58 = local_128.h;
      iStack_54 = local_128.d;
      local_88._40_4_ = local_128.dims;
      iStack_5c = local_128.w;
      local_50 = local_128.c;
      local_48 = local_128.cstep;
      if (local_128.refcount != (int *)0x0) {
        LOCK();
        *local_128.refcount = *local_128.refcount + -1;
        UNLOCK();
        if (*local_128.refcount == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            free(local_128.data);
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar18 = false;
    }
    else {
      bVar18 = uVar7 == 4;
      if (pMVar4->dims == 1 && bVar18) {
        sVar14 = (long)pMVar4->elempack * (long)pMVar4->w;
        iVar13 = (int)sVar14;
        if (iVar13 == pMVar4[1].elempack * pMVar4[1].c) {
          Mat::reshape(&local_128,pMVar4,1,1,1,pMVar4->w,opt->workspace_allocator);
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + 1;
            UNLOCK();
          }
          if ((int *)local_88._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_88._8_8_ == 0) {
              if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
                free((void *)local_88._0_8_);
              }
              else {
                (*(*(_func_int ***)local_88._32_8_)[3])();
              }
            }
          }
          local_88._0_8_ = local_128.data;
          local_88._8_8_ = local_128.refcount;
          local_88._16_8_ = local_128.elemsize;
          local_88._24_4_ = local_128.elempack;
          local_88._32_8_ = local_128.allocator;
          iStack_58 = local_128.h;
          iStack_54 = local_128.d;
          local_88._40_4_ = local_128.dims;
          iStack_5c = local_128.w;
          local_50 = local_128.c;
          local_48 = local_128.cstep;
          if (local_128.refcount != (int *)0x0) {
            LOCK();
            *local_128.refcount = *local_128.refcount + -1;
            UNLOCK();
            if (*local_128.refcount == 0) {
              if (local_128.allocator == (Allocator *)0x0) {
                free(local_128.data);
              }
              else {
                (*(local_128.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          iStack_5c = iVar13;
          local_88._40_4_ = 4;
          local_88._24_4_ = 1;
          local_88._16_8_ = pMVar4->elemsize / (ulong)(long)pMVar4->elempack;
          local_48 = sVar14;
        }
      }
    }
    iVar13 = pMVar4->dims;
    if ((bool)(iVar13 == 2 & bVar18)) {
      Mat::reshape(&local_128,pMVar4,1,1,pMVar4->w,pMVar4->h,opt->workspace_allocator);
      if (local_128.refcount != (int *)0x0) {
        LOCK();
        *local_128.refcount = *local_128.refcount + 1;
        UNLOCK();
      }
      if ((int *)local_88._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_88._8_8_ == 0) {
          if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
            free((void *)local_88._0_8_);
          }
          else {
            (*(*(_func_int ***)local_88._32_8_)[3])();
          }
        }
      }
      local_88._0_8_ = local_128.data;
      local_88._8_8_ = local_128.refcount;
      local_88._16_8_ = local_128.elemsize;
      local_88._24_4_ = local_128.elempack;
      local_88._32_8_ = local_128.allocator;
      iStack_58 = local_128.h;
      iStack_54 = local_128.d;
      local_88._40_4_ = local_128.dims;
      iStack_5c = local_128.w;
      local_50 = local_128.c;
      local_48 = local_128.cstep;
      if (local_128.refcount != (int *)0x0) {
        LOCK();
        *local_128.refcount = *local_128.refcount + -1;
        UNLOCK();
        if (*local_128.refcount == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            free(local_128.data);
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar13 = pMVar4->dims;
    }
    if (!(bool)(bVar18 & iVar13 == 3)) goto LAB_00375fc4;
    Mat::reshape(&local_128,pMVar4,1,pMVar4->w,pMVar4->h,pMVar4->c,opt->workspace_allocator);
    if (local_128.refcount != (int *)0x0) {
      LOCK();
      *local_128.refcount = *local_128.refcount + 1;
      UNLOCK();
    }
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._8_8_ == 0) {
        if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
          free((void *)local_88._0_8_);
        }
        else {
          (*(*(_func_int ***)local_88._32_8_)[3])();
        }
      }
    }
    local_88._0_8_ = local_128.data;
    local_88._8_8_ = local_128.refcount;
    local_88._16_8_ = local_128.elemsize;
    local_88._24_4_ = local_128.elempack;
    local_88._32_8_ = local_128.allocator;
    iStack_58 = local_128.h;
    iStack_54 = local_128.d;
    local_88._40_4_ = local_128.dims;
    iStack_5c = local_128.w;
    local_50 = local_128.c;
    local_48 = local_128.cstep;
    if (local_128.refcount != (int *)0x0) {
      LOCK();
      *local_128.refcount = *local_128.refcount + -1;
      UNLOCK();
      if (*local_128.refcount == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          free(local_128.data);
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar13 = pMVar4[1].dims;
    if (3 < iVar13) goto LAB_0037671b;
LAB_0037612a:
    bVar18 = uVar7 == 3;
    if (iVar13 == 1 && uVar7 == 3) {
      uVar15 = (ulong)pMVar4[1].elempack;
      sVar14 = uVar15 * (long)pMVar4[1].w;
      if ((int)sVar14 == pMVar4->elempack * pMVar4->c) {
        Mat::reshape(&local_128,pMVar17,1,1,pMVar4[1].w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar13 = pMVar4[1].dims;
        goto LAB_003762ee;
      }
      local_d8.dims = 3;
LAB_00376470:
      local_d8.w = (int)sVar14;
      local_d8.elempack = 1;
      local_d8.elemsize = pMVar4[1].elemsize / uVar15;
      local_d8.cstep = sVar14;
    }
    else {
LAB_003762ee:
      if ((bVar18) && (iVar13 == 2)) {
        Mat::reshape(&local_128,pMVar17,1,pMVar4[1].w,pMVar4[1].h,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar13 = pMVar4[1].dims;
      }
      if ((uVar7 == 4) && (iVar13 == 1)) {
        uVar15 = (ulong)pMVar4[1].elempack;
        sVar14 = uVar15 * (long)pMVar4[1].w;
        if ((int)sVar14 != pMVar4->elempack * pMVar4->c) {
          local_d8.dims = 4;
          goto LAB_00376470;
        }
        Mat::reshape(&local_128,pMVar17,1,1,1,pMVar4[1].w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar13 = pMVar4[1].dims;
      }
      if ((uVar7 == 4) && (iVar13 == 2)) {
        Mat::reshape(&local_128,pMVar17,1,1,pMVar4[1].w,pMVar4[1].h,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar13 = pMVar4[1].dims;
      }
      if ((uVar7 == 4) && (iVar13 == 3)) {
        Mat::reshape(&local_128,pMVar17,1,pMVar4[1].w,pMVar4[1].h,pMVar4[1].c,
                     opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
LAB_00375fc4:
    iVar13 = pMVar4[1].dims;
    if (iVar13 < (int)uVar7) {
      if (uVar7 != 2) goto LAB_0037612a;
      sVar14 = (long)pMVar4[1].elempack * (long)pMVar4[1].w;
      iVar16 = (int)sVar14;
      if (iVar16 == pMVar4->elempack * pMVar4->h) {
        Mat::reshape(&local_128,pMVar17,1,pMVar4[1].w,opt->workspace_allocator);
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + 1;
          UNLOCK();
        }
        if (local_d8.refcount != (int *)0x0) {
          LOCK();
          *local_d8.refcount = *local_d8.refcount + -1;
          UNLOCK();
          if (*local_d8.refcount == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              free(local_d8.data);
            }
            else {
              (*(local_d8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_d8.data = local_128.data;
        local_d8.refcount = local_128.refcount;
        local_d8.elemsize = local_128.elemsize;
        local_d8.elempack = local_128.elempack;
        local_d8.allocator = local_128.allocator;
        local_d8.dims = local_128.dims;
        local_d8.w = local_128.w;
        local_d8.h = local_128.h;
        local_d8.d = local_128.d;
        local_d8.c = local_128.c;
        local_d8.cstep = local_128.cstep;
        if (local_128.refcount != (int *)0x0) {
          LOCK();
          *local_128.refcount = *local_128.refcount + -1;
          UNLOCK();
          if (*local_128.refcount == 0) {
            if (local_128.allocator == (Allocator *)0x0) {
              free(local_128.data);
            }
            else {
              (*(local_128.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar13 = pMVar4[1].dims;
        bVar18 = false;
      }
      else {
        local_d8.dims = 2;
        local_d8.elempack = 1;
        bVar18 = false;
        local_d8.elemsize = pMVar4[1].elemsize / (ulong)(long)pMVar4[1].elempack;
        local_d8.w = iVar16;
        local_d8.cstep = sVar14;
      }
      goto LAB_003762ee;
    }
  }
LAB_0037671b:
  iVar13 = local_d8.w;
  if (local_d8.w < iStack_5c) {
    iVar13 = iStack_5c;
  }
  iVar16 = local_d8.h;
  if (local_d8.h < iStack_58) {
    iVar16 = iStack_58;
  }
  uVar3 = local_d8.c;
  if (local_d8.c < (int)local_50) {
    uVar3 = local_50;
  }
  opt_00 = (Option *)(ulong)uVar3;
  _elemsize = (Option *)local_d8.elemsize;
  if (local_d8.elemsize < (ulong)local_88._16_8_) {
    _elemsize = (Option *)local_88._16_8_;
  }
  _elempack = local_d8.elempack;
  if (local_d8.elempack < (int)local_88._24_4_) {
    _elempack = local_88._24_4_;
  }
  pOVar12 = (Option *)(ulong)_elempack;
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  switch(uVar7) {
  case 1:
    opt_00 = (Option *)opt->blob_allocator;
    Mat::create(pMVar4,iVar13,(size_t)_elemsize,_elempack,(Allocator *)opt_00);
    break;
  case 2:
    Mat::create(pMVar4,iVar13,iVar16,(size_t)_elemsize,_elempack,opt->blob_allocator);
    opt_00 = pOVar12;
    break;
  case 3:
    Mat::create(pMVar4,iVar13,iVar16,uVar3,(size_t)_elemsize,_elempack,opt->blob_allocator);
    opt_00 = _elemsize;
    break;
  case 4:
    _d = local_d8.d;
    if (local_d8.d < iStack_54) {
      _d = iStack_54;
    }
    Mat::create(pMVar4,iVar13,iVar16,_d,uVar3,(size_t)_elemsize,_elempack,opt->blob_allocator);
  }
  iVar13 = -100;
  if ((pMVar4->data == (void *)0x0) || ((long)pMVar4->c * pMVar4->cstep == 0)) goto LAB_003768dc;
  if ((int)local_88._24_4_ < local_d8.elempack) {
LAB_00376879:
    iVar13 = (local_38->super_BinaryOp).op_type;
    uVar3 = iVar13 - 1;
    if ((uVar3 < 0xb) && ((0x7e5U >> (uVar3 & 0x1f) & 1) != 0)) {
      iVar13 = *(int *)(&DAT_00542734 + (ulong)uVar3 * 4);
    }
    pMVar17 = &local_d8;
    b = (Mat *)local_88;
  }
  else {
    if (local_88._24_4_ == local_d8.elempack) {
      if ((int)(local_88._24_4_ * iStack_5c * iStack_58 * iStack_54 * local_50) <
          local_d8.elempack * local_d8.w * local_d8.h * local_d8.d * local_d8.c) goto LAB_00376879;
    }
    iVar13 = (local_38->super_BinaryOp).op_type;
    pMVar17 = (Mat *)local_88;
    b = &local_d8;
  }
  binary_op_broadcast(pMVar17,b,pMVar4,iVar13,opt_00);
  iVar13 = 0;
LAB_003768dc:
  if (local_d8.refcount != (int *)0x0) {
    LOCK();
    *local_d8.refcount = *local_d8.refcount + -1;
    UNLOCK();
    if (*local_d8.refcount == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        free(local_d8.data);
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((int *)local_88._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._8_8_ == 0) {
      if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
        free((void *)local_88._0_8_);
      }
      else {
        (*(*(_func_int ***)local_88._32_8_)[3])();
      }
    }
  }
  return iVar13;
}

Assistant:

int BinaryOp_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w * A.elempack == B.h * B.elempack)
                A2 = A.reshape(1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 2;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 3;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w * A.elempack == B.c * B.elempack)
                A2 = A.reshape(1, 1, 1, A.w, opt.workspace_allocator);
            else // if (A.w == B.w)
            {
                A2.dims = 4;
                A2.w = A.w * A.elempack;
                A2.elempack = 1;
                A2.elemsize = A.elemsize / A.elempack;
                A2.cstep = A2.w;
            }
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h, opt.workspace_allocator);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c, opt.workspace_allocator);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w * B.elempack == A.h * A.elempack)
                B2 = B.reshape(1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 2;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 3;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w * B.elempack == A.c * A.elempack)
                B2 = B.reshape(1, 1, 1, B.w, opt.workspace_allocator);
            else // if (B.w == A.w)
            {
                B2.dims = 4;
                B2.w = B.w * B.elempack;
                B2.elempack = 1;
                B2.elemsize = B.elemsize / B.elempack;
                B2.cstep = B2.w;
            }
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h, opt.workspace_allocator);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c, opt.workspace_allocator);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);
    const size_t out_elemsize = std::max(A2.elemsize, B2.elemsize);
    const int out_elempack = std::max(A2.elempack, B2.elempack);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    const bool a_pack_is_lower = A2.elempack < B2.elempack;
    const bool a_pack_is_equal = A2.elempack == B2.elempack;
    const bool a_size_is_lower = A2.w * A2.h * A2.d * A2.c * A2.elempack < B2.w * B2.h * B2.d * B2.c * B2.elempack;
    if (a_pack_is_lower || (a_pack_is_equal && a_size_is_lower))
    {
        binary_op_broadcast(B2, A2, top_blob, get_reverse_op_type(op_type), opt);
    }
    else
    {
        binary_op_broadcast(A2, B2, top_blob, op_type, opt);
    }

    return 0;
}